

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O2

void capnp::_::anon_unknown_0::checkStruct(StructReader reader)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  char cVar6;
  Exception *pEVar7;
  ulong uVar8;
  int i;
  ElementCount index;
  long lVar9;
  long lVar10;
  Fault f;
  CapTableReader *pCStack_100;
  WirePointer *local_f8;
  uint uStack_ec;
  uint local_e8;
  StructPointerCount local_e4;
  int local_e0;
  uint local_d0;
  StructPointerCount local_ca;
  PointerReader local_c8;
  StructReader subStruct;
  uint local_6c;
  Fault f_3;
  WirePointer *local_58;
  uint local_48;
  
  if (reader.dataSize < 0x40) {
    if (kj::_::Debug::minSeverity < 3) {
      pEVar7 = (Exception *)0x0;
LAB_001e2980:
      subStruct.segment = (SegmentReader *)0x1011121314151617;
      f.exception = pEVar7;
      kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,(unsigned_long_long *)&subStruct,(unsigned_long *)&f);
      goto LAB_001e29b3;
    }
  }
  else {
    pEVar7 = *reader.data;
    if ((pEVar7 != (Exception *)0x1011121314151617) && (kj::_::Debug::minSeverity < 3))
    goto LAB_001e2980;
LAB_001e29b3:
    if (reader.dataSize < 0x60) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e2d49;
      iVar3 = 0;
LAB_001e29f6:
      subStruct.segment = (SegmentReader *)CONCAT44(subStruct.segment._4_4_,0x20212223);
      f.exception._0_4_ = iVar3;
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 (uint *)&subStruct,(uint *)&f);
    }
    else {
      iVar3 = *(int *)((long)reader.data + 8);
      if ((iVar3 != 0x20212223) && (kj::_::Debug::minSeverity < 3)) goto LAB_001e29f6;
    }
    if (reader.dataSize < 0x70) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e2d49;
      sVar2 = 0;
LAB_001e2a6b:
      subStruct.segment = (SegmentReader *)CONCAT44(subStruct.segment._4_4_,0x3031);
      f.exception._0_2_ = sVar2;
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))\", 0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))",
                 (uint *)&subStruct,(unsigned_short *)&f);
    }
    else {
      sVar2 = *(short *)((long)reader.data + 0xc);
      if ((sVar2 != 0x3031) && (kj::_::Debug::minSeverity < 3)) goto LAB_001e2a6b;
    }
    if (reader.dataSize < 0x78) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e2d49;
      cVar6 = '\0';
LAB_001e2ae9:
      subStruct.segment = (SegmentReader *)CONCAT44(subStruct.segment._4_4_,0x40);
      f.exception._0_1_ = cVar6;
      kj::_::Debug::log<char_const(&)[74],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))\", 0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS)"
                 ,(char (*) [74])
                  "failed: expected (0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))",
                 (uint *)&subStruct,(uchar *)&f);
    }
    else {
      cVar6 = *(char *)((long)reader.data + 0xe);
      if (cVar6 != '@' && kj::_::Debug::minSeverity < 3) goto LAB_001e2ae9;
    }
    if (reader.dataSize < 0x79) {
LAB_001e2bc1:
      if (kj::_::Debug::minSeverity < 3) {
LAB_001e2bca:
        kj::_::Debug::log<char_const(&)[59]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf0,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(122 * ELEMENTS)\""
                   ,(char (*) [59])"failed: expected reader.getDataField<bool>(122 * ELEMENTS)");
        goto LAB_001e2bf5;
      }
LAB_001e2c8c:
      if (2 < kj::_::Debug::minSeverity) goto LAB_001e2d49;
LAB_001e2c9c:
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf3,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(125 * ELEMENTS)\"",
                 (char (*) [59])"failed: expected reader.getDataField<bool>(125 * ELEMENTS)");
    }
    else {
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)reader.data + 0xf)) == 1) {
        kj::_::Debug::log<char_const(&)[62]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xee,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(120 * ELEMENTS))\"",
                   (char (*) [62])"failed: expected !(reader.getDataField<bool>(120 * ELEMENTS))");
      }
      if (reader.dataSize == 0x79) goto LAB_001e2bc1;
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)reader.data + 0xf) >> 1) == 1) {
        kj::_::Debug::log<char_const(&)[62]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xef,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(121 * ELEMENTS))\"",
                   (char (*) [62])"failed: expected !(reader.getDataField<bool>(121 * ELEMENTS))");
      }
      if (reader.dataSize < 0x7b) goto LAB_001e2bc1;
      if (((*(byte *)((long)reader.data + 0xf) & 4) == 0) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001e2bca;
LAB_001e2bf5:
      if (reader.dataSize < 0x7c) {
LAB_001e2c3a:
        if (2 < kj::_::Debug::minSeverity) goto LAB_001e2c8c;
LAB_001e2c4d:
        kj::_::Debug::log<char_const(&)[59]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf2,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(124 * ELEMENTS)\""
                   ,(char (*) [59])"failed: expected reader.getDataField<bool>(124 * ELEMENTS)");
      }
      else {
        if (((*(byte *)((long)reader.data + 0xf) & 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[62]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0xf1,ERROR,
                     "\"failed: expected \" \"!(reader.getDataField<bool>(123 * ELEMENTS))\"",
                     (char (*) [62])"failed: expected !(reader.getDataField<bool>(123 * ELEMENTS))")
          ;
        }
        if (reader.dataSize == 0x7c) goto LAB_001e2c3a;
        if (((*(byte *)((long)reader.data + 0xf) & 0x10) == 0) && (kj::_::Debug::minSeverity < 3))
        goto LAB_001e2c4d;
      }
      if (reader.dataSize < 0x7e) goto LAB_001e2c8c;
      if (((*(byte *)((long)reader.data + 0xf) & 0x20) == 0) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001e2c9c;
    }
    if (reader.dataSize < 0x7f) {
      if (kj::_::Debug::minSeverity < 3) goto LAB_001e2ce7;
    }
    else {
      if (((*(byte *)((long)reader.data + 0xf) & 0x40) == 0) && (kj::_::Debug::minSeverity < 3)) {
LAB_001e2ce7:
        kj::_::Debug::log<char_const(&)[59]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf4,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(126 * ELEMENTS)\""
                   ,(char (*) [59])"failed: expected reader.getDataField<bool>(126 * ELEMENTS)");
      }
      if (((0x7f < reader.dataSize) && (*(char *)((long)reader.data + 0xf) < '\0')) &&
         (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[62]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0xf5,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(127 * ELEMENTS))\"",
                   (char (*) [62])"failed: expected !(reader.getDataField<bool>(127 * ELEMENTS))");
      }
    }
  }
LAB_001e2d49:
  if (reader.pointerCount == 0) {
    f.exception = (Exception *)0x0;
  }
  else {
    f.exception = (Exception *)reader.segment;
  }
  PointerReader::getStruct
            (&subStruct,(PointerReader *)&f,(word *)(anonymous_namespace)::SUBSTRUCT_DEFAULT);
  if (subStruct.dataSize < 0x20) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001e2e10;
    uVar4 = 0;
  }
  else {
    if ((*subStruct.data == 0x7b) || (2 < kj::_::Debug::minSeverity)) goto LAB_001e2e10;
    uVar4 = *subStruct.data;
  }
  f.exception._0_4_ = 0x7b;
  f_3.exception._0_4_ = uVar4;
  kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_int>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0xfa,ERROR,
             "\"failed: expected \" \"(123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))\", 123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS)"
             ,(char (*) [76])
              "failed: expected (123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))",
             (uint *)&f,(uint *)&f_3);
LAB_001e2e10:
  if (reader.pointerCount < 2) {
    f.exception = (Exception *)0x0;
  }
  else {
    f.exception = (Exception *)reader.segment;
  }
  PointerReader::getList((ListReader *)&subStruct,(PointerReader *)&f,FOUR_BYTES,(word *)0x0);
  if ((int)subStruct.pointers != 3) {
    f_3.exception._0_4_ = 3;
    local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,(int)subStruct.pointers);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xff,FAILED,"(3 * ELEMENTS) == (list.size())","3 * ELEMENTS, list.size()",
               (uint *)&f_3,(uint *)&local_c8);
    kj::_::Debug::Fault::fatal(&f);
  }
  if (kj::_::Debug::minSeverity < 3 && *subStruct.data != 200) {
    f.exception._0_4_ = 200;
    f_3.exception._0_4_ = *subStruct.data;
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x100,ERROR,
               "\"failed: expected \" \"(200) == (list.getDataElement<int32_t>(0 * ELEMENTS))\", 200, list.getDataElement<int32_t>(0 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (200) == (list.getDataElement<int32_t>(0 * ELEMENTS))",(int *)&f,
               (int *)&f_3);
  }
  if (kj::_::Debug::minSeverity < 3 &&
      *(int *)((long)subStruct.data + (ulong)(subStruct.pointers._4_4_ >> 3)) != 0xc9) {
    f.exception._0_4_ = 0xc9;
    f_3.exception._0_4_ =
         *(undefined4 *)((long)subStruct.data + (ulong)(subStruct.pointers._4_4_ >> 3));
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x101,ERROR,
               "\"failed: expected \" \"(201) == (list.getDataElement<int32_t>(1 * ELEMENTS))\", 201, list.getDataElement<int32_t>(1 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (201) == (list.getDataElement<int32_t>(1 * ELEMENTS))",(int *)&f,
               (int *)&f_3);
  }
  if ((*(int *)((long)subStruct.data + (ulong)(subStruct.pointers._4_4_ >> 2)) != 0xca) &&
     (kj::_::Debug::minSeverity < 3)) {
    f.exception._0_4_ = 0xca;
    f_3.exception._0_4_ =
         *(undefined4 *)((long)subStruct.data + (ulong)(subStruct.pointers._4_4_ >> 2));
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x102,ERROR,
               "\"failed: expected \" \"(202) == (list.getDataElement<int32_t>(2 * ELEMENTS))\", 202, list.getDataElement<int32_t>(2 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (202) == (list.getDataElement<int32_t>(2 * ELEMENTS))",(int *)&f,
               (int *)&f_3);
  }
  if (reader.pointerCount < 3) {
    f.exception = (Exception *)0x0;
    pCStack_100 = (CapTableReader *)0x0;
    local_f8 = (WirePointer *)0x0;
    iVar3 = 0x7fffffff;
  }
  else {
    local_f8 = reader.pointers + 2;
    f.exception = (Exception *)reader.segment;
    pCStack_100 = reader.capTable;
    iVar3 = reader.nestingLimit;
  }
  index = 0;
  PointerReader::getList((ListReader *)&subStruct,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
  if ((int)subStruct.pointers != 4) {
    f_3.exception._0_4_ = 4;
    local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,(int)subStruct.pointers);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x108,FAILED,"(4 * ELEMENTS) == (list.size())","4 * ELEMENTS, list.size()",
               (uint *)&f_3,(uint *)&local_c8);
    kj::_::Debug::Fault::fatal(&f);
  }
  local_ca = reader.pointerCount;
  do {
    if (index == 4) {
      if (local_ca < 4) {
        f.exception = (Exception *)0x0;
        local_f8 = (WirePointer *)0x0;
        reader.nestingLimit = 0x7fffffff;
      }
      else {
        local_f8 = reader.pointers + 3;
        f.exception = (Exception *)reader.segment;
      }
      PointerReader::getList((ListReader *)&subStruct,(PointerReader *)&f,POINTER,(word *)0x0);
      if ((int)subStruct.pointers != 5) {
        f_3.exception._0_4_ = 5;
        local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,(int)subStruct.pointers)
        ;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x115,FAILED,"(5 * ELEMENTS) == (list.size())","5 * ELEMENTS, list.size()",
                   (uint *)&f_3,(uint *)&local_c8);
        kj::_::Debug::Fault::fatal(&f);
      }
      lVar9 = 1;
      uVar8 = 0;
      while( true ) {
        if (uVar8 == 5) {
          return;
        }
        f_3.exception = (Exception *)subStruct.segment;
        PointerReader::getList((ListReader *)&f,(PointerReader *)&f_3,TWO_BYTES,(word *)0x0);
        uVar8 = uVar8 + 1;
        if (uVar8 != (uint)reader.nestingLimit) break;
        for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
          uVar1 = *(ushort *)
                   ((long)&(local_f8->offsetAndKind).value + ((ulong)uStack_ec * lVar10 >> 3));
          if ((lVar10 + 500U != (ulong)uVar1) && (kj::_::Debug::minSeverity < 3)) {
            f_3.exception._0_4_ = (int)lVar10 + 500;
            local_c8.segment = (SegmentReader *)CONCAT62(local_c8.segment._2_6_,uVar1);
            kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_short>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                       ,0x11b,ERROR,
                       "\"failed: expected \" \"(500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))\", 500u + j, element.getDataElement<uint16_t>(j * ELEMENTS)"
                       ,(char (*) [80])
                        "failed: expected (500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))"
                       ,(uint *)&f_3,(unsigned_short *)&local_c8);
          }
        }
        lVar9 = lVar9 + 1;
      }
      local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,(int)uVar8);
      local_d0 = reader.nestingLimit;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                (&f_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x119,FAILED,"((i + 1) * ELEMENTS) == (element.size())",
                 "(i + 1) * ELEMENTS, element.size()",(uint *)&local_c8,&local_d0);
      kj::_::Debug::Fault::fatal(&f_3);
    }
    ListReader::getStructElement((StructReader *)&f,(ListReader *)&subStruct,index);
    if (local_e8 < 0x20) {
      if (kj::_::Debug::minSeverity < 3) {
        uVar5 = 0;
LAB_001e308f:
        f_3.exception._0_4_ = index + 300;
        local_c8.segment = (SegmentReader *)CONCAT44(local_c8.segment._4_4_,uVar5);
        kj::_::Debug::log<char_const(&)[76],int,int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x10b,ERROR,
                   "\"failed: expected \" \"(300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))\", 300 + i, element.getDataField<int32_t>(0 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))",
                   (int *)&f_3,(int *)&local_c8);
      }
    }
    else if ((index + 300 != (local_f8->offsetAndKind).value) && (kj::_::Debug::minSeverity < 3)) {
      uVar5 = (local_f8->offsetAndKind).value;
      goto LAB_001e308f;
    }
    if (local_e4 == 0) {
      local_c8.segment = (SegmentReader *)0x0;
      local_c8.capTable = (CapTableReader *)0x0;
      local_c8.pointer = (WirePointer *)0x0;
      local_c8.nestingLimit = 0x7fffffff;
    }
    else {
      local_c8.pointer = (WirePointer *)CONCAT44(uStack_ec,iVar3);
      local_c8.segment = (SegmentReader *)f.exception;
      local_c8.capTable = pCStack_100;
      local_c8.nestingLimit = local_e0;
    }
    PointerReader::getStruct
              ((StructReader *)&f_3,&local_c8,
               (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
    if (((local_48 < 0x20) || (index + 400 != (local_58->offsetAndKind).value)) &&
       (kj::_::Debug::minSeverity < 3)) {
      if (local_e4 == 0) {
        local_c8.segment = (SegmentReader *)0x0;
        local_c8.capTable = (CapTableReader *)0x0;
        local_c8.pointer = (WirePointer *)0x0;
        local_c8.nestingLimit = 0x7fffffff;
      }
      else {
        local_c8.pointer = (WirePointer *)CONCAT44(uStack_ec,iVar3);
        local_c8.segment = (SegmentReader *)f.exception;
        local_c8.capTable = pCStack_100;
        local_c8.nestingLimit = local_e0;
      }
      local_d0 = index + 400;
      PointerReader::getStruct
                ((StructReader *)&f_3,&local_c8,
                 (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
      local_6c = 0;
      if (0x1f < local_48) {
        local_6c = (local_58->offsetAndKind).value;
      }
      kj::_::Debug::log<char_const(&)[162],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x10f,ERROR,
                 "\"failed: expected \" \"(400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))\", 400 + i, element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS)"
                 ,(char (*) [162])
                  "failed: expected (400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))"
                 ,(int *)&local_d0,(int *)&local_6c);
    }
    index = index + 1;
  } while( true );
}

Assistant:

static void checkStruct(StructReader reader) {
  EXPECT_EQ(0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS));
  EXPECT_EQ(0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(120 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(121 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(122 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(123 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(124 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(125 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(126 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(127 * ELEMENTS));

  {
    StructReader subStruct = reader.getPointerField(0 * POINTERS)
                                   .getStruct(SUBSTRUCT_DEFAULT.words);
    EXPECT_EQ(123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(1 * POINTERS).getList(ElementSize::FOUR_BYTES, nullptr);
    ASSERT_EQ(3 * ELEMENTS, list.size());
    EXPECT_EQ(200, list.getDataElement<int32_t>(0 * ELEMENTS));
    EXPECT_EQ(201, list.getDataElement<int32_t>(1 * ELEMENTS));
    EXPECT_EQ(202, list.getDataElement<int32_t>(2 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(2 * POINTERS)
                            .getList(ElementSize::INLINE_COMPOSITE, nullptr);
    ASSERT_EQ(4 * ELEMENTS, list.size());
    for (int i = 0; i < 4; i++) {
      StructReader element = list.getStructElement(i * ELEMENTS);
      EXPECT_EQ(300 + i, element.getDataField<int32_t>(0 * ELEMENTS));
      EXPECT_EQ(400 + i,
          element.getPointerField(0 * POINTERS)
                 .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words)
                 .getDataField<int32_t>(0 * ELEMENTS));
    }
  }

  {
    ListReader list = reader.getPointerField(3 * POINTERS).getList(ElementSize::POINTER, nullptr);
    ASSERT_EQ(5 * ELEMENTS, list.size());
    for (uint i = 0; i < 5; i++) {
      ListReader element = list.getPointerElement(i * ELEMENTS)
                               .getList(ElementSize::TWO_BYTES, nullptr);
      ASSERT_EQ((i + 1) * ELEMENTS, element.size());
      for (uint j = 0; j <= i; j++) {
        EXPECT_EQ(500u + j, element.getDataElement<uint16_t>(j * ELEMENTS));
      }
    }
  }
}